

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

Transform * __thiscall sf::Transform::getInverse(Transform *this)

{
  float *in_RSI;
  Transform *in_RDI;
  float fVar1;
  float det;
  
  fVar1 = in_RSI[3] * (in_RSI[0xd] * in_RSI[4] + -(in_RSI[5] * in_RSI[0xc])) +
          *in_RSI * (in_RSI[0xf] * in_RSI[5] + -(in_RSI[7] * in_RSI[0xd])) +
          -(in_RSI[1] * (in_RSI[0xf] * in_RSI[4] + -(in_RSI[7] * in_RSI[0xc])));
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    Transform(in_RDI,(in_RSI[0xf] * in_RSI[5] + -(in_RSI[7] * in_RSI[0xd])) / fVar1,
              -(in_RSI[0xf] * in_RSI[4] + -(in_RSI[7] * in_RSI[0xc])) / fVar1,
              (in_RSI[0xd] * in_RSI[4] + -(in_RSI[5] * in_RSI[0xc])) / fVar1,
              -(in_RSI[0xf] * in_RSI[1] + -(in_RSI[3] * in_RSI[0xd])) / fVar1,
              (in_RSI[0xf] * *in_RSI + -(in_RSI[3] * in_RSI[0xc])) / fVar1,
              -(in_RSI[0xd] * *in_RSI + -(in_RSI[1] * in_RSI[0xc])) / fVar1,
              (in_RSI[7] * in_RSI[1] + -(in_RSI[3] * in_RSI[5])) / fVar1,
              -(in_RSI[7] * *in_RSI + -(in_RSI[3] * in_RSI[4])) / fVar1,
              (in_RSI[5] * *in_RSI + -(in_RSI[1] * in_RSI[4])) / fVar1);
  }
  else {
    memcpy(in_RDI,Identity,0x40);
  }
  return in_RDI;
}

Assistant:

Transform Transform::getInverse() const
{
    // Compute the determinant
    float det = m_matrix[0] * (m_matrix[15] * m_matrix[5] - m_matrix[7] * m_matrix[13]) -
                m_matrix[1] * (m_matrix[15] * m_matrix[4] - m_matrix[7] * m_matrix[12]) +
                m_matrix[3] * (m_matrix[13] * m_matrix[4] - m_matrix[5] * m_matrix[12]);

    // Compute the inverse if the determinant is not zero
    // (don't use an epsilon because the determinant may *really* be tiny)
    if (det != 0.f)
    {
        return Transform( (m_matrix[15] * m_matrix[5] - m_matrix[7] * m_matrix[13]) / det,
                         -(m_matrix[15] * m_matrix[4] - m_matrix[7] * m_matrix[12]) / det,
                          (m_matrix[13] * m_matrix[4] - m_matrix[5] * m_matrix[12]) / det,
                         -(m_matrix[15] * m_matrix[1] - m_matrix[3] * m_matrix[13]) / det,
                          (m_matrix[15] * m_matrix[0] - m_matrix[3] * m_matrix[12]) / det,
                         -(m_matrix[13] * m_matrix[0] - m_matrix[1] * m_matrix[12]) / det,
                          (m_matrix[7]  * m_matrix[1] - m_matrix[3] * m_matrix[5])  / det,
                         -(m_matrix[7]  * m_matrix[0] - m_matrix[3] * m_matrix[4])  / det,
                          (m_matrix[5]  * m_matrix[0] - m_matrix[1] * m_matrix[4])  / det);
    }
    else
    {
        return Identity;
    }
}